

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::detail::
create_leaf_if_needed<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>
          (detail *this,
          olc_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>_> *cached_leaf,
          basic_art_key<unsigned_long> k,value_view v,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance)

{
  value_view v_00;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_00;
  bool bVar1;
  deleter_type *this_01;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *poVar2;
  pointer __p;
  unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  local_40;
  db_type *local_30;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance_local;
  olc_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>_> *cached_leaf_local;
  value_view v_local;
  basic_art_key<unsigned_long> k_local;
  
  local_30 = (db_type *)v._M_extent._M_extent_value;
  v_local._M_ptr = v._M_ptr;
  db_instance_local =
       (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this;
  cached_leaf_local =
       (olc_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>_> *)k.field_0;
  v_local._M_extent._M_extent_value = (size_t)cached_leaf;
  bVar1 = std::operator==((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                           *)this,(nullptr_t)0x0);
  if (bVar1) {
    this_01 = std::
              unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              ::get_deleter((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             *)db_instance_local);
    poVar2 = basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             ::get_db(this_01);
    this_00 = db_instance_local;
    if (poVar2 != local_30) {
      __assert_fail("&cached_leaf.get_deleter().get_db() == &db_instance",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                    ,0x58b,
                    "void unodb::detail::create_leaf_if_needed(olc_db_leaf_unique_ptr<Key, Value> &, basic_art_key<Key>, unodb::value_view, unodb::olc_db<Key, Value> &) [Key = unsigned long, Value = std::span<const std::byte>]"
                   );
    }
    v_00._M_extent._M_extent_value = (size_t)v_local._M_ptr;
    v_00._M_ptr = (pointer)cached_leaf_local;
    basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
    ::make_db_leaf_ptr((basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
                        *)&local_40,(art_key_type)v_local._M_extent._M_extent_value,v_00,local_30);
    __p = std::
          unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::release(&local_40);
    std::
    unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::reset((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
             *)this_00,__p);
    std::
    unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr(&local_40);
  }
  return;
}

Assistant:

void create_leaf_if_needed(olc_db_leaf_unique_ptr<Key, Value>& cached_leaf,
                           basic_art_key<Key> k, unodb::value_view v,
                           unodb::olc_db<Key, Value>& db_instance) {
  if (UNODB_DETAIL_LIKELY(cached_leaf == nullptr)) {
    UNODB_DETAIL_ASSERT(&cached_leaf.get_deleter().get_db() == &db_instance);
    // Do not assign because we do not need to assign the deleter
    // NOLINTNEXTLINE(misc-uniqueptr-reset-release)
    cached_leaf.reset(
        olc_art_policy<Key, Value>::make_db_leaf_ptr(k, v, db_instance)
            .release());
  }
}